

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_filter.cpp
# Opt level: O2

void __thiscall
duckdb::ConstantFilter::ConstantFilter
          (ConstantFilter *this,ExpressionType comparison_type_p,Value *constant_p)

{
  InternalException *this_00;
  allocator local_41;
  string local_40;
  
  (this->super_TableFilter).filter_type = CONSTANT_COMPARISON;
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)&PTR__ConstantFilter_0178bcd8;
  (this->super_TableFilter).field_0x9 = comparison_type_p;
  Value::Value(&this->constant,constant_p);
  if ((this->constant).is_null != true) {
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"ConstantFilter constant cannot be NULL - use IsNullFilter instead"
             ,&local_41);
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ConstantFilter::ConstantFilter(ExpressionType comparison_type_p, Value constant_p)
    : TableFilter(TableFilterType::CONSTANT_COMPARISON), comparison_type(comparison_type_p),
      constant(std::move(constant_p)) {
	if (constant.IsNull()) {
		throw InternalException("ConstantFilter constant cannot be NULL - use IsNullFilter instead");
	}
}